

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

void __thiscall
lossless_neural_sound::expression_compiler::expression::Product::write_expression
          (Product *this,ostream *os,Expression_writing_state *state)

{
  anon_class_24_3_f6ef14e5 fn;
  char *separator;
  Parenthesis_writer pw;
  
  Expression_node::Expression_writing_state::Parenthesis_writer::Parenthesis_writer
            (&pw,state,os,Times,true);
  separator = "";
  fn.separator = &separator;
  fn.os = os;
  fn.state = state;
  Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
  visit_leaves<lossless_neural_sound::expression_compiler::expression::Product::write_expression(std::ostream&,lossless_neural_sound::expression_compiler::expression::Expression_node::Expression_writing_state&)const::_lambda(lossless_neural_sound::expression_compiler::expression::Expression_node_const*)_1_>
            (&this->
              super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>,
             fn);
  Expression_node::Expression_writing_state::Parenthesis_writer::~Parenthesis_writer(&pw);
  return;
}

Assistant:

virtual void write_expression(std::ostream &os, Expression_writing_state &state) const override
    {
        Expression_writing_state::Parenthesis_writer pw(
            state, os, Expression_writing_state::Precedence::Times);
        auto separator = "";
        visit_leaves([&](const Expression_node *factor)
                     {
                         os << separator;
                         separator = " * ";
                         factor->write_expression(os, state);
                     });
    }